

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O0

string * __thiscall
jbcoin::STLedgerEntry::getFullText_abi_cxx11_(string *__return_storage_ptr__,STLedgerEntry *this)

{
  KnownFormats<jbcoin::LedgerEntryType> *this_00;
  string *psVar1;
  base_uint<256UL,_void> *a;
  string local_78;
  string local_58;
  allocator local_22;
  undefined1 local_21;
  Item *local_20;
  Item *format;
  STLedgerEntry *this_local;
  string *ret;
  
  format = (Item *)this;
  this_local = (STLedgerEntry *)__return_storage_ptr__;
  this_00 = &LedgerFormats::getInstance()->super_KnownFormats<jbcoin::LedgerEntryType>;
  local_20 = KnownFormats<jbcoin::LedgerEntryType>::findByType(this_00,this->type_);
  if (local_20 != (Item *)0x0) {
    local_21 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    to_string<256ul,void>(&local_58,(jbcoin *)&this->key_,a);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\" = { ");
    psVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::getName_abi_cxx11_(local_20);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    STObject::getFullText_abi_cxx11_(&local_78,&this->super_STObject);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid ledger entry type");
}

Assistant:

std::string STLedgerEntry::getFullText () const
{
    auto const format =
        LedgerFormats::getInstance().findByType (type_);

    if (format == nullptr)
        Throw<std::runtime_error> ("invalid ledger entry type");

    std::string ret = "\"";
    ret += to_string (key_);
    ret += "\" = { ";
    ret += format->getName ();
    ret += ", ";
    ret += STObject::getFullText ();
    ret += "}";
    return ret;
}